

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O2

u32 __thiscall tl::calcSizeUtf32(tl *this,CStr o)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  u32 uVar4;
  uint i;
  CStr o_local;
  
  o_local._str = o._0_8_;
  o_local._size = (u32)this;
  uVar4 = 0;
  i = 0;
  do {
    if ((uint)this <= i) {
      return uVar4;
    }
    cVar1 = CStrT<char>::operator[](&o_local,i);
    iVar3 = 1;
    if (cVar1 < '\0') {
      bVar2 = CStrT<char>::operator[](&o_local,i);
      iVar3 = 2;
      if ((bVar2 & 0xe0) != 0xc0) {
        bVar2 = CStrT<char>::operator[](&o_local,i);
        iVar3 = 3;
        if ((bVar2 & 0xf0) != 0xe0) {
          bVar2 = CStrT<char>::operator[](&o_local,i);
          iVar3 = 4;
          if ((bVar2 & 0xf8) != 0xf0) {
            return 0xffffffff;
          }
        }
      }
    }
    i = i + iVar3;
    uVar4 = uVar4 + 1;
    this = (tl *)(ulong)o_local._size;
  } while( true );
}

Assistant:

u32 calcSizeUtf32(CStr o)
{
    u32 size = 0;
    for(u32 i=0; i<o.size(); ) {
        if((o[i] & 0b10000000) == 0) { // 1 byte
            i++;
            size++;
        }
        else if((o[i] & 0b11100000) == 0b11000000) { // 2 bytes
            i += 2;
            size++;
        }
        else if((o[i] & 0b11110000) == 0b11100000) { // 3 bytes
            i += 3;
            size++;
        }
        else if((o[i] & 0b11111000) == 0b11110000) { // 4 bytes
            i += 4;
            size++;
        }
        else {
            return TOKEN_ERROR;
        }
    }
    return size;
}